

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::generate_freecad_fill
          (three_dim_model *this,Path *outline,Paths *primary,Paths *secondary,int *layer_number)

{
  pointer pvVar1;
  Paths *pPVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  string *this_01;
  pointer pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a0;
  Paths *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::to_string(&local_120,*layer_number);
  std::operator+(&local_160,"    subtractive_ingredients_",&local_120);
  std::operator+(&local_140,&local_160," = []");
  local_a0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->py_script;
  local_98 = secondary;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_a0,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  pvVar1 = (primary->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar3 = (primary->
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1) {
    local_140._M_dataplus._M_p._0_1_ = 1;
    local_160._M_dataplus._M_p._0_1_ = 0;
    push_freecad_pss(this,pvVar3,(bool *)&local_140,layer_number,(bool *)&local_160,
                     &this->subtractive_overlap_factor);
  }
  build_subtractive_shapes(this,layer_number);
  std::__cxx11::to_string(&local_50,*layer_number);
  std::operator+(&local_c0,"    subtractive_cut_",&local_50);
  std::operator+(&local_100,&local_c0,"= additive_block_");
  pPVar2 = local_98;
  this_00 = local_a0;
  std::__cxx11::to_string(&local_70,*layer_number);
  std::operator+(&local_e0,&local_100,&local_70);
  std::operator+(&local_120,&local_e0,".cut(subtractives_");
  std::__cxx11::to_string(&local_90,*layer_number);
  std::operator+(&local_160,&local_120,&local_90);
  std::operator+(&local_140,&local_160,")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  if ((pPVar2->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (pPVar2->
      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::to_string(&local_e0,*layer_number);
    std::operator+(&local_120,"    layer_",&local_e0);
    std::operator+(&local_160,&local_120,"=subtractive_cut_");
    std::__cxx11::to_string(&local_100,*layer_number);
    std::operator+(&local_140,&local_160,&local_100);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_120);
    this_01 = &local_e0;
  }
  else {
    std::__cxx11::to_string(&local_120,*layer_number);
    std::operator+(&local_160,"    additive_ingredients_",&local_120);
    std::operator+(&local_140,&local_160," = []");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_120);
    pvVar1 = (pPVar2->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = (pPVar2->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1)
    {
      local_140._M_dataplus._M_p._0_1_ = 0;
      local_160._M_dataplus._M_p._0_1_ = 1;
      push_freecad_pss(this,pvVar3,(bool *)&local_140,layer_number,(bool *)&local_160,
                       &this->island_overlap_factor);
    }
    std::__cxx11::to_string(&local_100,*layer_number);
    std::operator+(&local_e0,"    additives_",&local_100);
    std::operator+(&local_120,&local_e0," = list(pool.map(create_pss, additive_ingredients_");
    this_00 = local_a0;
    std::__cxx11::to_string(&local_c0,*layer_number);
    std::operator+(&local_160,&local_120,&local_c0);
    std::operator+(&local_140,&local_160,"))");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::to_string(&local_50,*layer_number);
    std::operator+(&local_c0,"    layer_",&local_50);
    std::operator+(&local_100,&local_c0,"=subtractive_cut_");
    std::__cxx11::to_string(&local_70,*layer_number);
    std::operator+(&local_e0,&local_100,&local_70);
    std::operator+(&local_120,&local_e0,".fuse(additives_");
    std::__cxx11::to_string(&local_90,*layer_number);
    std::operator+(&local_160,&local_120,&local_90);
    std::operator+(&local_140,&local_160,")");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    this_01 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::to_string(&local_100,*layer_number);
  std::operator+(&local_e0,"    lyr_",&local_100);
  std::operator+(&local_120,&local_e0," = My_doc.addObject(\"Part::Feature\",\"layer_");
  std::__cxx11::to_string(&local_c0,*layer_number);
  std::operator+(&local_160,&local_120,&local_c0);
  std::operator+(&local_140,&local_160,"\")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::to_string(&local_e0,*layer_number);
  std::operator+(&local_120,"    lyr_",&local_e0);
  std::operator+(&local_160,&local_120,".Shape = layer_");
  std::__cxx11::to_string(&local_100,*layer_number);
  std::operator+(&local_140,&local_160,&local_100);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_fill(
const ClipperLib::Path &outline,
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const int &layer_number)
{
    // Create the list of subtractive shapes
    py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        push_freecad_pss(*primary_it, true, layer_number, false, subtractive_overlap_factor);
    }
    // Build them in python as a list
    build_subtractive_shapes(layer_number);
    // Execute the boolean cut.
    py_script.push_back("    subtractive_cut_"
    +std::to_string(layer_number)
    +"= additive_block_"
    +std::to_string(layer_number)
    +".cut(subtractives_"
    +std::to_string(layer_number)+")");
    // if additive shapes exist
    // Create the list of additive shapes
    if(secondary.size()>0)
    {
        py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            push_freecad_pss(*secondary_it, false, layer_number, true, island_overlap_factor);
        }
        // Generate the additive shapes
        py_script.push_back("    additives_"
        +std::to_string(layer_number)+
        " = list(pool.map(create_pss, additive_ingredients_"
        +std::to_string(layer_number)+"))");
        // Execute the boolean fuse
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number)
        +".fuse(additives_"
        +std::to_string(layer_number)+")");
    }
    else
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number) );
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
}